

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_FFDHE.c
# Opt level: O2

void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a,uint64_t *p_r2_n)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  ulong uVar4;
  undefined7 in_register_00000039;
  uint8_t *puVar5;
  uint8_t *os;
  uint8_t *b;
  uint8_t local_438 [248];
  undefined8 uStack_340;
  uint8_t auStack_338 [248];
  undefined8 uStack_240;
  uint8_t auStack_238 [120];
  undefined8 uStack_1c0;
  uint8_t auStack_1b8 [120];
  undefined8 uStack_140;
  uint8_t auStack_138 [248];
  code *pcStack_40;
  
  pcStack_40 = (code *)0x14b492;
  uVar1 = ffdhe_len(a);
  switch(CONCAT71(in_register_00000039,a) & 0xffffffff) {
  case 0:
    b = auStack_138;
    uStack_140 = 0x14b4ce;
    memset(b,0,0x100);
    puVar5 = Hacl_Impl_FFDHE_Constants_ffdhe_p2048;
    break;
  case 1:
    b = auStack_1b8;
    uStack_1c0 = 0x14b565;
    memset(b,0,0x180);
    puVar5 = Hacl_Impl_FFDHE_Constants_ffdhe_p3072;
    break;
  case 2:
    b = auStack_238;
    uStack_240 = 0x14b51b;
    memset(b,0,0x200);
    puVar5 = Hacl_Impl_FFDHE_Constants_ffdhe_p4096;
    break;
  case 3:
    b = auStack_338;
    uStack_340 = 0x14b540;
    memset(b,0,0x300);
    puVar5 = Hacl_Impl_FFDHE_Constants_ffdhe_p6144;
    break;
  case 4:
    b = local_438;
    memset(b,0,0x400);
    puVar5 = Hacl_Impl_FFDHE_Constants_ffdhe_p8192;
    break;
  default:
    pcStack_40 = (code *)0x14b612;
    fprintf(_stderr,"KaRaMeL incomplete match at %s:%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/cryspen[P]hacl-packages/src/Hacl_FFDHE.c"
            ,99);
    pcStack_40 = Hacl_FFDHE_ffdhe_secret_to_public_precomp;
    exit(0xfd);
  }
  b[-8] = 'x';
  b[-7] = 0xb5;
  b[-6] = '\x14';
  b[-5] = '\0';
  b[-4] = '\0';
  b[-3] = '\0';
  b[-2] = '\0';
  b[-1] = '\0';
  uVar2 = ffdhe_len(a);
  for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
    b[uVar4] = puVar5[uVar4];
  }
  b[-8] = 0xa5;
  b[-7] = 0xb5;
  b[-6] = '\x14';
  b[-5] = '\0';
  b[-4] = '\0';
  b[-3] = '\0';
  b[-2] = '\0';
  b[-1] = '\0';
  uVar2 = ffdhe_len(a);
  b[-8] = 0xb2;
  b[-7] = 0xb5;
  b[-6] = '\x14';
  b[-5] = '\0';
  b[-4] = '\0';
  b[-3] = '\0';
  b[-2] = '\0';
  b[-1] = '\0';
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(uVar2,b,p_r2_n);
  b[-8] = 0xba;
  b[-7] = 0xb5;
  b[-6] = '\x14';
  b[-5] = '\0';
  b[-4] = '\0';
  b[-3] = '\0';
  b[-2] = '\0';
  b[-1] = '\0';
  uVar2 = ffdhe_len(a);
  builtin_memcpy(b + -8,"͵\x14",4);
  b[-4] = '\0';
  b[-3] = '\0';
  b[-2] = '\0';
  b[-1] = '\0';
  uVar3 = ffdhe_len(a);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64
            ((uVar2 - 1 >> 3) + 1,uVar3 * 8 - 1,p_r2_n,
             (uint64_t *)((long)p_r2_n + (ulong)(uVar1 - 1 & 0xfffffff8) + 8));
  return;
}

Assistant:

static inline void ffdhe_precomp_p(Spec_FFDHE_ffdhe_alg a, uint64_t *p_r2_n)
{
  uint32_t nLen = (ffdhe_len(a) - 1U) / 8U + 1U;
  uint64_t *p_n = p_r2_n;
  uint64_t *r2_n = p_r2_n + nLen;
  uint32_t sw;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        sw = 256U;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        sw = 384U;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        sw = 512U;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        sw = 768U;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        sw = 1024U;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  KRML_CHECK_SIZE(sizeof (uint8_t), sw);
  uint8_t p_s[sw];
  memset(p_s, 0U, sw * sizeof (uint8_t));
  const uint8_t *p;
  switch (a)
  {
    case Spec_FFDHE_FFDHE2048:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p2048;
        break;
      }
    case Spec_FFDHE_FFDHE3072:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p3072;
        break;
      }
    case Spec_FFDHE_FFDHE4096:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p4096;
        break;
      }
    case Spec_FFDHE_FFDHE6144:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p6144;
        break;
      }
    case Spec_FFDHE_FFDHE8192:
      {
        p = Hacl_Impl_FFDHE_Constants_ffdhe_p8192;
        break;
      }
    default:
      {
        KRML_HOST_EPRINTF("KaRaMeL incomplete match at %s:%d\n", __FILE__, __LINE__);
        KRML_HOST_EXIT(253U);
      }
  }
  uint32_t len = ffdhe_len(a);
  for (uint32_t i = 0U; i < len; i++)
  {
    uint8_t *os = p_s;
    uint8_t x = p[i];
    os[i] = x;
  }
  Hacl_Bignum_Convert_bn_from_bytes_be_uint64(ffdhe_len(a), p_s, p_n);
  Hacl_Bignum_Montgomery_bn_precomp_r2_mod_n_u64((ffdhe_len(a) - 1U) / 8U + 1U,
    8U * ffdhe_len(a) - 1U,
    p_n,
    r2_n);
}